

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void roaring_bitmap_xor_inplace(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  ushort key;
  int iVar1;
  shared_container_t *container;
  int *c;
  container_t *c_00;
  ushort *puVar2;
  long lVar3;
  ushort uVar4;
  uint8_t uVar5;
  ulong uVar6;
  int *piVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint8_t type2;
  uint8_t result_type;
  uint8_t local_46;
  uint8_t local_45;
  uint local_44;
  roaring_array_t *local_40;
  ulong local_38;
  
  local_45 = '\0';
  local_44 = (x2->high_low_container).size;
  if (local_44 == 0) {
    return;
  }
  uVar11 = (x1->high_low_container).size;
  uVar6 = (ulong)uVar11;
  if (uVar11 == 0) {
    (x1->high_low_container).flags =
         (x1->high_low_container).flags & 0xfe | (x2->high_low_container).flags & 1;
    ra_overwrite(&x2->high_low_container,&x1->high_low_container,
                 (_Bool)((x2->high_low_container).flags & 1));
    return;
  }
  uVar4 = *(x1->high_low_container).keys;
  puVar2 = (x2->high_low_container).keys;
  uVar9 = 0;
  uVar12 = 0;
  local_40 = &x2->high_low_container;
LAB_00107cbe:
  do {
    uVar11 = (uint)uVar12;
    key = *puVar2;
    uVar9 = (ulong)(int)uVar9;
    uVar10 = (int)uVar6 - 1;
    while( true ) {
      uVar8 = (uint)uVar9;
      if (uVar4 == key) break;
      if (key <= uVar4) {
        local_46 = local_40->typecodes[uVar12 & 0xffff];
        c_00 = get_copy_of_container
                         (local_40->containers[uVar12 & 0xffff],&local_46,
                          (_Bool)(local_40->flags & 1));
        if ((local_40->flags & 1) != 0) {
          local_40->containers[(int)uVar11] = c_00;
          local_40->typecodes[(int)uVar11] = local_46;
        }
        ra_insert_new_key_value_at(&x1->high_low_container,uVar8,key,c_00,local_46);
        uVar6 = (ulong)((int)uVar6 + 1);
        uVar11 = uVar11 + 1;
        uVar12 = (ulong)uVar11;
        if (uVar11 != local_44) {
          uVar9 = uVar9 + 1;
          puVar2 = (ushort *)((ulong)((uVar11 & 0xffff) * 2) + (long)local_40->keys);
          goto LAB_00107cbe;
        }
        uVar8 = uVar8 + 1;
        uVar11 = local_44;
        goto LAB_00107ef1;
      }
      if (uVar10 == uVar8) goto LAB_00107ef6;
      uVar9 = uVar9 + 1;
      uVar4 = (x1->high_low_container).keys[uVar9 & 0xffff];
    }
    uVar5 = (x1->high_low_container).typecodes[uVar9 & 0xffff];
    container = (shared_container_t *)(x1->high_low_container).containers[uVar9 & 0xffff];
    local_46 = local_40->typecodes[uVar12 & 0xffff];
    local_38 = uVar6;
    if (uVar5 == '\x04') {
      c = (int *)container_xor(container,'\x04',local_40->containers[uVar12 & 0xffff],local_46,
                               &local_45);
      shared_container_free(container);
    }
    else {
      c = (int *)container_ixor(container,uVar5,local_40->containers[uVar12 & 0xffff],local_46,
                                &local_45);
    }
    piVar7 = c;
    uVar5 = local_45;
    if (local_45 == '\x04') {
      uVar5 = (uint8_t)c[2];
      piVar7 = *(int **)c;
    }
    iVar1 = *piVar7;
    if ((uVar5 == '\x03') || (uVar5 == '\x02')) {
      if (iVar1 < 1) goto LAB_00107e45;
LAB_00107e6a:
      (x1->high_low_container).containers[uVar9] = c;
      (x1->high_low_container).typecodes[uVar9] = local_45;
      uVar9 = (ulong)(uVar8 + 1);
      uVar6 = local_38;
    }
    else {
      if (iVar1 != 0) {
        if (iVar1 != -1) goto LAB_00107e6a;
        lVar3 = 0;
        do {
          if (*(long *)(*(long *)(piVar7 + 2) + lVar3 * 8) != 0) goto LAB_00107e6a;
          lVar3 = lVar3 + 1;
        } while (lVar3 != 0x400);
      }
LAB_00107e45:
      container_free(c,local_45);
      ra_remove_at_index(&x1->high_low_container,uVar8);
      uVar6 = (ulong)uVar10;
    }
    uVar11 = uVar11 + 1;
    uVar12 = (ulong)uVar11;
    uVar8 = (uint)uVar9;
    if ((uVar8 == (uint)uVar6) || (uVar11 == local_44)) {
LAB_00107ef1:
      if (uVar8 != (uint)uVar6) {
        return;
      }
LAB_00107ef6:
      ra_append_copy_range
                (&x1->high_low_container,local_40,uVar11,local_44,(_Bool)(local_40->flags & 1));
      return;
    }
    uVar4 = (x1->high_low_container).keys[uVar8 & 0xffff];
    puVar2 = (ushort *)((ulong)((uVar11 & 0xffff) * 2) + (long)local_40->keys);
  } while( true );
}

Assistant:

void roaring_bitmap_xor_inplace(roaring_bitmap_t *x1,
                                const roaring_bitmap_t *x2) {
    assert(x1 != x2);
    uint8_t result_type = 0;
    int length1 = x1->high_low_container.size;
    const int length2 = x2->high_low_container.size;

    if (0 == length2) return;

    if (0 == length1) {
        roaring_bitmap_overwrite(x1, x2);
        return;
    }

    // XOR can have new containers inserted from x2, but can also
    // lose containers when x1 and x2 are nonempty and identical.

    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
    uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);
    while (true) {
        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);

            // We do the computation "in place" only when c1 is not a shared
            // container. Rationale: using a shared container safely with in
            // place computation would require making a copy and then doing the
            // computation in place which is likely less efficient than avoiding
            // in place entirely and always generating a new container.

            container_t *c;
            if (type1 == SHARED_CONTAINER_TYPE) {
                c = container_xor(c1, type1, c2, type2, &result_type);
                shared_container_free(CAST_shared(c1));  // so release
            } else {
                c = container_ixor(c1, type1, c2, type2, &result_type);
            }

            if (container_nonzero_cardinality(c, result_type)) {
                ra_set_container_at_index(&x1->high_low_container, pos1, c,
                                          result_type);
                ++pos1;
            } else {
                container_free(c, result_type);
                ra_remove_at_index(&x1->high_low_container, pos1);
                --length1;
            }

            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
            s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);

        } else if (s1 < s2) {  // s1 < s2
            pos1++;
            if (pos1 == length1) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);

        } else {  // s1 > s2
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);
            c2 = get_copy_of_container(c2, &type2, is_cow(x2));
            if (is_cow(x2)) {
                ra_set_container_at_index(&x2->high_low_container, pos2, c2,
                                          type2);
            }

            ra_insert_new_key_value_at(&x1->high_low_container, pos1, s2, c2,
                                       type2);
            pos1++;
            length1++;
            pos2++;
            if (pos2 == length2) break;
            s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);
        }
    }
    if (pos1 == length1) {
        ra_append_copy_range(&x1->high_low_container, &x2->high_low_container,
                             pos2, length2, is_cow(x2));
    }
}